

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O0

void lj_symtab_dump(lj_wbuf *out,global_State *g,uint32_t *lib_adds)

{
  lj_wbuf *buf;
  long in_RSI;
  GCtrace *in_RDI;
  GCproto *pt;
  symbol_resolver_conf conf;
  size_t ljs_header_len;
  GCobj *o;
  GCRef *iter;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint8_t b;
  lj_wbuf *in_stack_ffffffffffffffa0;
  lj_wbuf *local_20;
  
  local_20 = (lj_wbuf *)(in_RSI + 0x60);
  buf = (lj_wbuf *)(ulong)*(uint *)(in_RSI + 0x188);
  lj_wbuf_addn(buf,in_RDI,(size_t)in_stack_ffffffffffffffa0);
  while( true ) {
    b = (uint8_t)(in_stack_ffffffffffffff9c >> 0x18);
    local_20 = (lj_wbuf *)(ulong)*(uint *)&local_20->writer;
    if (local_20 == (lj_wbuf *)0x0) break;
    in_stack_ffffffffffffff9c = (uint)*(byte *)((long)&local_20->writer + 5);
    if (in_stack_ffffffffffffff9c == 7) {
      in_stack_ffffffffffffffa0 = local_20;
      lj_wbuf_addbyte(local_20,'\0');
      lj_symtab_dump_proto
                (in_stack_ffffffffffffffa0,
                 (GCproto *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    else if (in_stack_ffffffffffffff9c == 9) {
      lj_wbuf_addbyte(in_stack_ffffffffffffffa0,'\0');
      lj_symtab_dump_trace(buf,in_RDI);
    }
  }
  dl_iterate_phdr(resolve_symbolnames,&stack0xffffffffffffffa8);
  lj_wbuf_addbyte(in_stack_ffffffffffffffa0,b);
  return;
}

Assistant:

void lj_symtab_dump(struct lj_wbuf *out, const struct global_State *g,
		    uint32_t *lib_adds)
{
  const GCRef *iter = &g->gc.root;
  const GCobj *o;
  const size_t ljs_header_len = sizeof(ljs_header) / sizeof(ljs_header[0]);

#if LJ_HASRESOLVER
  struct symbol_resolver_conf conf = {
    .buf = out,
    .L = gco2th(gcref(g->cur_L)),
    .header = SYMTAB_CFUNC,
    .cur_lib = 0,
    .to_dump_cnt = 0,
    .lib_adds = lib_adds
  };
#else
  UNUSED(lib_adds);
#endif

  /* Write prologue. */
  lj_wbuf_addn(out, ljs_header, ljs_header_len);

  while ((o = gcref(*iter)) != NULL) {
    switch (o->gch.gct) {
    case (~LJ_TPROTO): {
      const GCproto *pt = gco2pt(o);
      lj_wbuf_addbyte(out, SYMTAB_LFUNC);
      lj_symtab_dump_proto(out, pt);
      break;
    }
#if LJ_HASJIT
    case (~LJ_TTRACE): {
      lj_wbuf_addbyte(out, SYMTAB_TRACE);
      lj_symtab_dump_trace(out, gco2trace(o));
      break;
    }
#endif /* LJ_HASJIT */
    default:
      break;
    }
    iter = &o->gch.nextgc;
  }

#if LJ_HASRESOLVER
  /* Write C symbols. */
  dl_iterate_phdr(resolve_symbolnames, &conf);
#endif
  lj_wbuf_addbyte(out, SYMTAB_FINAL);
}